

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O0

stbrp__findresult stbrp__skyline_pack_rectangle(stbrp_context *context,int width,int height)

{
  stbrp_node *psVar1;
  stbrp_node *psVar2;
  bool bVar3;
  stbrp_node *next_1;
  stbrp_node *next;
  stbrp_node *cur;
  stbrp_node *node;
  int height_local;
  int width_local;
  stbrp_context *context_local;
  stbrp__findresult res;
  
  _context_local = stbrp__skyline_find_best_pos(context,width,height);
  if (((res._0_8_ == 0) || (context->height < context_local._4_4_ + height)) ||
     (context->free_head == (stbrp_node *)0x0)) {
    res._0_8_ = (stbrp_node **)0x0;
  }
  else {
    psVar1 = context->free_head;
    psVar1->x = (stbrp_coord)context_local;
    psVar1->y = context_local._4_2_ + (short)height;
    context->free_head = psVar1->next;
    next = *(stbrp_node **)res._0_8_;
    if ((int)(uint)next->x < (int)context_local) {
      psVar2 = next->next;
      next->next = psVar1;
      next = psVar2;
    }
    else {
      *(stbrp_node **)res._0_8_ = psVar1;
    }
    while( true ) {
      bVar3 = false;
      if (next->next != (stbrp_node *)0x0) {
        bVar3 = (int)(uint)next->next->x <= (int)context_local + width;
      }
      if (!bVar3) break;
      psVar2 = next->next;
      next->next = context->free_head;
      context->free_head = next;
      next = psVar2;
    }
    psVar1->next = next;
    if ((int)(uint)next->x < (int)context_local + width) {
      next->x = (stbrp_coord)context_local + (short)width;
    }
  }
  return _context_local;
}

Assistant:

static stbrp__findresult stbrp__skyline_pack_rectangle(stbrp_context *context, int width, int height)
{
   // find best position according to heuristic
   stbrp__findresult res = stbrp__skyline_find_best_pos(context, width, height);
   stbrp_node *node, *cur;

   // bail if:
   //    1. it failed
   //    2. the best node doesn't fit (we don't always check this)
   //    3. we're out of memory
   if (res.prev_link == NULL || res.y + height > context->height || context->free_head == NULL) {
      res.prev_link = NULL;
      return res;
   }

   // on success, create new node
   node = context->free_head;
   node->x = (stbrp_coord) res.x;
   node->y = (stbrp_coord) (res.y + height);

   context->free_head = node->next;

   // insert the new node into the right starting point, and
   // let 'cur' point to the remaining nodes needing to be
   // stiched back in

   cur = *res.prev_link;
   if (cur->x < res.x) {
      // preserve the existing one, so start testing with the next one
      stbrp_node *next = cur->next;
      cur->next = node;
      cur = next;
   } else {
      *res.prev_link = node;
   }

   // from here, traverse cur and free the nodes, until we get to one
   // that shouldn't be freed
   while (cur->next && cur->next->x <= res.x + width) {
      stbrp_node *next = cur->next;
      // move the current node to the free list
      cur->next = context->free_head;
      context->free_head = cur;
      cur = next;
   }

   // stitch the list back in
   node->next = cur;

   if (cur->x < res.x + width)
      cur->x = (stbrp_coord) (res.x + width);

#ifdef _DEBUG
   cur = context->active_head;
   while (cur->x < context->width) {
      STBRP_ASSERT(cur->x < cur->next->x);
      cur = cur->next;
   }
   STBRP_ASSERT(cur->next == NULL);

   {
      int count=0;
      cur = context->active_head;
      while (cur) {
         cur = cur->next;
         ++count;
      }
      cur = context->free_head;
      while (cur) {
         cur = cur->next;
         ++count;
      }
      STBRP_ASSERT(count == context->num_nodes+2);
   }
#endif

   return res;
}